

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginMenu(char *label,bool enabled)

{
  int iVar1;
  ImGuiWindow *this;
  ImGuiPopupData *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ImGuiID id;
  ImU32 col;
  long lVar8;
  ImGuiWindow *pIVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  float fVar13;
  ImVec2 IVar14;
  undefined8 extraout_XMM0_Qb;
  float fVar15;
  float fVar16;
  ImVec2 IVar17;
  float fVar18;
  ImVec2 ta;
  ImVec2 popup_pos;
  ImVec2 tb;
  ImVec2 tc;
  ImVec2 local_88;
  ImVec2 local_80;
  ulong local_78;
  float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImGuiWindow *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  uVar12 = 0;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  IVar14 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_68._8_8_ = extraout_XMM0_Qb;
  local_68._0_4_ = IVar14.x;
  local_68._4_4_ = IVar14.y;
  bVar4 = IsPopupOpen(id);
  if ((this->Flags & 0x4000000) == 0) {
    iVar1 = (pIVar3->BeginPopupStack).Size;
    if (iVar1 < (pIVar3->OpenPopupStack).Size) {
      lVar8 = (long)(this->IDStack).Size;
      if (lVar8 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                      ,0x50d,"T &ImVector<unsigned int>::back() [T = unsigned int]");
      }
      uVar12 = (ulong)((pIVar3->OpenPopupStack).Data[iVar1].OpenParentId ==
                      (this->IDStack).Data[lVar8 + -1]);
    }
    else {
      uVar12 = 0;
    }
  }
  local_48 = pIVar3->NavWindow;
  if ((char)uVar12 != '\0') {
    pIVar3->NavWindow = this;
  }
  local_80.x = 0.0;
  local_80.y = 0.0;
  fVar15 = (this->DC).CursorPos.x;
  fVar13 = (this->DC).CursorPos.y;
  local_58 = ZEXT416((uint)fVar13);
  local_78 = uVar12;
  if ((this->DC).LayoutType == 0) {
    fVar18 = (pIVar3->Style).ItemSpacing.x;
    local_58 = ZEXT416((uint)(fVar13 - (pIVar3->Style).FramePadding.y));
    fVar13 = ImGuiWindow::MenuBarHeight(this);
    local_80.y = fVar13 + (float)local_58._0_4_;
    local_80.x = (fVar15 + -1.0) - (float)(int)(fVar18 * 0.5);
    fVar13 = (pIVar3->Style).ItemSpacing.x;
    (this->DC).CursorPos.x = (float)(int)(fVar13 * 0.5) + (this->DC).CursorPos.x;
    local_88.y = (pIVar3->Style).ItemSpacing.y;
    local_88.x = fVar13 + fVar13;
    PushStyleVar(0xd,&local_88);
    local_88.y = 0.0;
    local_88.x = (float)local_68._0_4_;
    bVar5 = Selectable(label,bVar4,(uint)!enabled * 8 + 0x300001,&local_88);
    PopStyleVar(1);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar3->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
  }
  else {
    local_80.y = fVar13 - (pIVar3->Style).WindowPadding.y;
    local_80.x = fVar15;
    local_6c = ImGuiMenuColumns::DeclColumns
                         (&(this->DC).MenuColumns,(float)local_68._0_4_,0.0,
                          (float)(int)(pIVar3->FontSize * 1.2));
    IVar14 = GetContentRegionAvail();
    fVar13 = IVar14.x - local_6c;
    local_68 = ZEXT416(~-(uint)(fVar13 <= 0.0) & (uint)fVar13);
    local_88.y = 0.0;
    local_88.x = local_6c;
    bVar5 = Selectable(label,bVar4,(uint)!enabled * 8 + 0xb00001,&local_88);
    col = GetColorU32((uint)!enabled,1.0);
    IVar14.x = pIVar3->FontSize * 0.3 + (float)local_68._0_4_ + (this->DC).MenuColumns.Pos[2] +
               fVar15;
    IVar14.y = (float)local_58._0_4_ + 0.0;
    RenderArrow(this->DrawList,IVar14,col,1,1.0);
  }
  if (enabled) {
    bVar6 = ItemHoverable(&(this->DC).LastItemRect,id);
  }
  else {
    bVar6 = false;
  }
  if ((byte)local_78 != 0) {
    pIVar3->NavWindow = local_48;
  }
  if ((this->DC).LayoutType == 1) {
    iVar1 = (pIVar3->BeginPopupStack).Size;
    if ((iVar1 < (pIVar3->OpenPopupStack).Size) &&
       (pIVar2 = (pIVar3->OpenPopupStack).Data, pIVar2[iVar1].SourceWindow == this)) {
      pIVar9 = pIVar2[iVar1].Window;
    }
    else {
      pIVar9 = (ImGuiWindow *)0x0;
    }
    bVar7 = true;
    if (((pIVar3->HoveredWindow == this) && (pIVar9 != (ImGuiWindow *)0x0)) &&
       ((this->Flags & 0x400) == 0)) {
      local_38.x = (pIVar9->Pos).x;
      fVar13 = (pIVar9->Pos).y;
      fVar15 = (pIVar9->Size).x + local_38.x;
      IVar17 = pIVar9->Pos;
      fVar18 = (pIVar3->IO).MousePos.x - (pIVar3->IO).MouseDelta.x;
      local_88.y = (pIVar3->IO).MousePos.y - (pIVar3->IO).MouseDelta.y;
      bVar7 = local_38.x != (this->Pos).x;
      bVar10 = (this->Pos).x <= local_38.x;
      if (!bVar10 || !bVar7) {
        IVar17.y = fVar13;
        IVar17.x = fVar15;
        local_38.x = fVar15;
      }
      local_40.x = IVar17.x;
      fVar16 = ABS(fVar18 - local_40.x) * 0.3;
      fVar15 = 30.0;
      if (fVar16 <= 30.0) {
        fVar15 = fVar16;
      }
      fVar15 = (float)(-(uint)(fVar16 < 5.0) & 0x40a00000 | ~-(uint)(fVar16 < 5.0) & (uint)fVar15);
      local_88.x = fVar18 + *(float *)(&DAT_002baf88 + (ulong)(bVar10 && bVar7) * 4);
      local_40.y = IVar17.y;
      fVar18 = (local_40.y - fVar15) - local_88.y;
      if (fVar18 <= -100.0) {
        fVar18 = -100.0;
      }
      local_40.y = fVar18 + local_88.y;
      fVar13 = ((pIVar9->Size).y + fVar13 + fVar15) - local_88.y;
      if (100.0 <= fVar13) {
        fVar13 = 100.0;
      }
      local_38.y = fVar13 + local_88.y;
      bVar7 = ImTriangleContainsPoint(&local_88,&local_40,&local_38,&(pIVar3->IO).MousePos);
      bVar7 = !bVar7;
    }
    if ((bVar6 != false || !bVar4) || (pIVar3->HoveredWindow != this)) {
      bVar10 = false;
    }
    else {
      bVar10 = (bool)(pIVar3->HoveredIdPreviousFrame != 0 & bVar7 &
                     pIVar3->HoveredIdPreviousFrame != id);
    }
    bVar11 = (bool)(~bVar4 & bVar6 & bVar5);
    if (bVar6 == false) {
      bVar7 = bVar11;
    }
    if (bVar4) {
      bVar7 = bVar11;
    }
    if (bVar5 != false) {
      bVar7 = bVar11;
    }
    if (pIVar3->NavActivateId == id) {
      bVar10 = bVar4;
      bVar7 = !bVar4;
    }
    if (((pIVar3->NavId != id) || (pIVar3->NavMoveRequest != true)) || (pIVar3->NavMoveDir != 1))
    goto LAB_00211653;
  }
  else {
    if (bVar5 != false) {
      bVar10 = (bool)((byte)local_78 & bVar5 & bVar4);
      bVar4 = (bool)(bVar4 ^ bVar10);
      bVar7 = (bool)(bVar10 ^ 1);
      goto LAB_00211653;
    }
    if ((byte)(bVar4 | (byte)local_78 & bVar6 ^ 1) != 1) {
      bVar7 = true;
      bVar10 = false;
      goto LAB_00211653;
    }
    if ((pIVar3->NavId != id) || (pIVar3->NavMoveRequest != true)) {
      bVar7 = false;
      bVar10 = false;
      goto LAB_00211653;
    }
    bVar10 = false;
    if (pIVar3->NavMoveDir != 3) {
      bVar7 = false;
      goto LAB_00211653;
    }
  }
  NavMoveRequestCancel();
  bVar7 = true;
LAB_00211653:
  if (((!enabled) || (bVar10 != false)) && (bVar5 = IsPopupOpen(id), bVar5)) {
    ClosePopupToLevel((pIVar3->BeginPopupStack).Size,true);
  }
  if (((~bVar7 & 1U) == 0 && bVar4 == false) &&
     ((pIVar3->BeginPopupStack).Size < (pIVar3->OpenPopupStack).Size)) {
    OpenPopup(label);
    return false;
  }
  if (bVar7 != false) {
    OpenPopup(label);
  }
  if (bVar4 != false || bVar7 != false) {
    local_88.x = 0.0;
    local_88.y = 0.0;
    SetNextWindowPos(&local_80,1,&local_88);
    bVar4 = BeginPopupEx(id,(uint)((this->Flags & 0x14000000U) != 0) << 0x18 | 0x10080145);
    return bVar4;
  }
  return false;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}